

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O1

void emit_string(char *str,FILE *out)

{
  ushort **ppuVar1;
  uint __c;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *str;
  if (cVar2 != '\0') {
    ppuVar1 = __ctype_b_loc();
    pcVar3 = str + 1;
    do {
      __c = (uint)cVar2;
      if ((short)(*ppuVar1)[(ulong)__c & 0xff] < 0) {
LAB_0010506e:
        putc(__c,(FILE *)out);
      }
      else {
        if (((*ppuVar1)[(ulong)__c & 0xff] >> 0xd & 1) != 0) {
          __c = 0x5f;
          goto LAB_0010506e;
        }
        fprintf((FILE *)out,"\\%.3o");
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

static void
emit_string(const char *str, FILE *out)
   /* Print a string with spaces replaced by '_' and non-printing characters by
    * an octal escape.
    */
{
   for (; *str; ++str)
      if (isgraph(UCHAR_MAX & *str))
         putc(*str, out);

      else if (isspace(UCHAR_MAX & *str))
         putc('_', out);

      else
         fprintf(out, "\\%.3o", *str);
}